

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampler.cpp
# Opt level: O1

Vector3D * __thiscall
CGL::CosineWeightedHemisphereSampler3D::get_sample
          (Vector3D *__return_storage_ptr__,CosineWeightedHemisphereSampler3D *this,double *pdf)

{
  result_type rVar1;
  result_type rVar2;
  uint uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)minstd_engine);
  rVar2 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)minstd_engine);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = rVar1;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = rVar2;
  auVar9 = vpunpcklqdq_avx(auVar9,auVar8);
  auVar8 = vpblendd_avx2(auVar9,(undefined1  [16])0x0,10);
  auVar15._8_8_ = 0x4330000000000000;
  auVar15._0_8_ = 0x4330000000000000;
  auVar8 = vpor_avx(auVar8,auVar15);
  auVar9 = vpsrlq_avx(auVar9,0x20);
  auVar16._8_8_ = 0x4530000000000000;
  auVar16._0_8_ = 0x4530000000000000;
  auVar9 = vpor_avx(auVar9,auVar16);
  auVar17._8_8_ = 0x4530000000100000;
  auVar17._0_8_ = 0x4530000000100000;
  auVar9 = vsubpd_avx(auVar9,auVar17);
  auVar10._0_8_ = (auVar8._0_8_ + auVar9._0_8_) * 2.3283064370807974e-10;
  auVar10._8_8_ = (auVar8._8_8_ + auVar9._8_8_) * 2.3283064370807974e-10;
  auVar14._8_8_ = 0x3e7ad7f29abcaf48;
  auVar14._0_8_ = 0x3e7ad7f29abcaf48;
  auVar9 = vmaxpd_avx(auVar14,auVar10);
  auVar11._8_8_ = 0x3feffffffaa19c47;
  auVar11._0_8_ = 0x3feffffffaa19c47;
  auVar8 = vcmppd_avx(auVar11,auVar9,1);
  uVar3 = vmovmskpd_avx(auVar8);
  if ((uVar3 & 2) == 0) {
    auVar8 = vshufpd_avx(auVar9,auVar9,1);
  }
  else {
    auVar8 = ZEXT816(0x3feffffffaa19c47);
  }
  dVar7 = auVar8._0_8_;
  if (dVar7 < 0.0) {
    dVar4 = sqrt(dVar7);
  }
  else {
    auVar8 = vsqrtsd_avx(auVar8,auVar8);
    dVar4 = auVar8._0_8_;
  }
  if ((uVar3 & 1) == 0) {
    dVar6 = auVar9._0_8_ * 6.283185307179586;
  }
  else {
    dVar6 = 6.283185244347733;
  }
  dVar7 = 1.0 - dVar7;
  if (dVar7 < 0.0) {
    dVar5 = sqrt(dVar7);
  }
  else {
    auVar12._8_8_ = 0;
    auVar12._0_8_ = dVar7;
    auVar8 = vsqrtsd_avx(auVar12,auVar12);
    dVar5 = auVar8._0_8_;
  }
  *pdf = dVar5 / 3.141592653589793;
  dVar5 = cos(dVar6);
  dVar6 = sin(dVar6);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar7;
  if (dVar7 < 0.0) {
    dVar7 = sqrt(dVar7);
  }
  else {
    auVar8 = vsqrtsd_avx(auVar13,auVar13);
    dVar7 = auVar8._0_8_;
  }
  (__return_storage_ptr__->field_0).field_0.x = dVar5 * dVar4;
  (__return_storage_ptr__->field_0).field_0.y = dVar6 * dVar4;
  (__return_storage_ptr__->field_0).field_0.z = dVar7;
  return __return_storage_ptr__;
}

Assistant:

Vector3D CosineWeightedHemisphereSampler3D::get_sample(double *pdf) const {

  double Xi1 = random_uniform();
  double Xi2 = random_uniform();

  double r = sqrt(Xi1);
  double theta = 2. * PI * Xi2;
  *pdf = sqrt(1-Xi1) / PI;
  return Vector3D(r*cos(theta), r*sin(theta), sqrt(1-Xi1));
}